

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<char,_false,_5>_> __thiscall
immutable::rrb_details::rrb_drop_right<char,false,5>
          (rrb_details *this,ref<immutable::rrb<char,_false,_5>_> *in,uint32_t right)

{
  int *piVar1;
  rrb<char,_false,_5> *prVar2;
  leaf_node<char,_false> *plVar3;
  uint32_t *puVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  tree_node<char,_false> *ptVar8;
  undefined8 *puVar9;
  ulong uVar10;
  char *__function;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_tail;
  ref<immutable::rrb_details::tree_node<char,_false>_> root;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_40;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_38;
  
  if (right == 0) {
    puVar9 = (undefined8 *)malloc(0x28);
    *puVar9 = 0;
    *(undefined4 *)(puVar9 + 1) = 0;
    puVar9[2] = 0;
    puVar9[3] = 0;
    local_40.ptr = (leaf_node<char,_false> *)malloc(0x18);
    (local_40.ptr)->type = LEAF_NODE;
    (local_40.ptr)->len = 0;
    (local_40.ptr)->child = (char *)0x0;
    (local_40.ptr)->guid = 0;
    (local_40.ptr)->_ref_count = 1;
    ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
              ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar9 + 2),&local_40);
    if ((local_40.ptr != (leaf_node<char,_false> *)0x0) &&
       (uVar11 = (local_40.ptr)->_ref_count, (local_40.ptr)->_ref_count = uVar11 - 1, uVar11 == 1))
    {
      free(local_40.ptr);
    }
    *(undefined8 **)this = puVar9;
    *(undefined4 *)(puVar9 + 4) = 1;
    return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
  }
  prVar2 = in->ptr;
  if (prVar2 != (rrb<char,_false,_5> *)0x0) {
    if (prVar2->cnt <= right) {
      *(rrb<char,_false,_5> **)this = prVar2;
      prVar2->_ref_count = prVar2->_ref_count + 1;
      return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
    }
    uVar12 = prVar2->cnt - prVar2->tail_len;
    uVar13 = right - uVar12;
    if (right < uVar12 || uVar13 == 0) {
      puVar9 = (undefined8 *)malloc(0x28);
      *puVar9 = 0;
      *(undefined4 *)(puVar9 + 1) = 0;
      puVar9[2] = 0;
      puVar9[3] = 0;
      local_40.ptr = (leaf_node<char,_false> *)malloc(0x18);
      (local_40.ptr)->type = LEAF_NODE;
      (local_40.ptr)->len = 0;
      (local_40.ptr)->child = (char *)0x0;
      (local_40.ptr)->guid = 0;
      (local_40.ptr)->_ref_count = 1;
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar9 + 2),&local_40);
      if ((local_40.ptr != (leaf_node<char,_false> *)0x0) &&
         (uVar11 = (local_40.ptr)->_ref_count, (local_40.ptr)->_ref_count = uVar11 - 1, uVar11 == 1)
         ) {
        free(local_40.ptr);
      }
      *(undefined8 **)this = puVar9;
      *(undefined4 *)(puVar9 + 4) = 1;
      prVar2 = in->ptr;
      if (prVar2 != (rrb<char,_false,_5> *)0x0) {
        rrb_drop_right_rec<char,false,5>
                  ((rrb_details *)&local_38,(uint32_t *)((long)puVar9 + 4),&prVar2->root,right - 1,
                   prVar2->shift,false);
        puVar4 = *(uint32_t **)this;
        if (puVar4 != (uint32_t *)0x0) {
          *puVar4 = right;
          if (local_38.ptr != (tree_node<char,_false> *)0x0) {
            (local_38.ptr)->_ref_count = (local_38.ptr)->_ref_count + 1;
          }
          local_40.ptr = *(leaf_node<char,_false> **)(puVar4 + 6);
          *(tree_node<char,_false> **)(puVar4 + 6) = local_38.ptr;
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_40);
          promote_rightmost_leaf<char,false,5>((ref<immutable::rrb<char,_false,_5>_> *)this);
          lVar5 = *(long *)this;
          if (lVar5 != 0) {
            if (*(long *)(lVar5 + 0x10) != 0) {
              *(undefined4 *)(lVar5 + 8) = *(undefined4 *)(*(long *)(lVar5 + 0x10) + 4);
              ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_38);
              return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
            }
LAB_00147686:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
            ;
            goto LAB_001476b2;
          }
        }
      }
    }
    else {
      puVar9 = (undefined8 *)malloc(0x28);
      uVar6 = *(undefined8 *)prVar2;
      uVar7 = *(undefined8 *)&prVar2->tail_len;
      ptVar8 = (prVar2->root).ptr;
      puVar9[2] = (prVar2->tail).ptr;
      puVar9[3] = ptVar8;
      *puVar9 = uVar6;
      puVar9[1] = uVar7;
      puVar9[4] = *(undefined8 *)&prVar2->_ref_count;
      if (puVar9[3] != 0) {
        piVar1 = (int *)(puVar9[3] + 8);
        *piVar1 = *piVar1 + 1;
      }
      if (puVar9[2] != 0) {
        piVar1 = (int *)(puVar9[2] + 8);
        *piVar1 = *piVar1 + 1;
      }
      *(undefined8 **)this = puVar9;
      if (puVar9 != (undefined8 *)0x0) {
        *(undefined4 *)(puVar9 + 4) = 1;
      }
      local_40.ptr = (leaf_node<char,_false> *)malloc((ulong)uVar13 + 0x18);
      uVar11 = right - uVar12;
      (local_40.ptr)->len = uVar11;
      (local_40.ptr)->type = LEAF_NODE;
      (local_40.ptr)->child = (char *)(local_40.ptr + 1);
      (local_40.ptr)->guid = 0;
      if (uVar11 != 0) {
        uVar10 = 0;
        do {
          (local_40.ptr)->child[uVar10] = '\0';
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
      }
      (local_40.ptr)->_ref_count = 1;
      if (right != uVar12) {
        uVar10 = 0;
        do {
          if (in->ptr == (rrb<char,_false,_5> *)0x0) goto LAB_0014769d;
          plVar3 = (in->ptr->tail).ptr;
          if ((plVar3 == (leaf_node<char,_false> *)0x0) ||
             (local_40.ptr == (leaf_node<char,_false> *)0x0)) goto LAB_00147686;
          (local_40.ptr)->child[uVar10] = plVar3->child[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar11 + (uVar11 == 0) != uVar10);
      }
      puVar4 = *(uint32_t **)this;
      if (puVar4 != (uint32_t *)0x0) {
        *puVar4 = right;
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar4 + 4),&local_40);
        if (*(long *)this != 0) {
          *(uint32_t *)(*(long *)this + 8) = uVar11;
          if (local_40.ptr == (leaf_node<char,_false> *)0x0) {
            return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
          }
          uVar11 = (local_40.ptr)->_ref_count;
          (local_40.ptr)->_ref_count = uVar11 - 1;
          if (uVar11 != 1) {
            return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
          }
          free(local_40.ptr);
          return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
        }
      }
    }
  }
LAB_0014769d:
  __function = 
  "T *immutable::ref<immutable::rrb<char, false>>::operator->() const [T = immutable::rrb<char, false>]"
  ;
LAB_001476b2:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_drop_right(ref<rrb<T, atomic_ref_counting, N>> in, const uint32_t right)
      {
      using namespace rrb_details;
      if (right == 0)
        {
        return rrb_create<T, atomic_ref_counting, N>();
        }
      else if (right < in->cnt)
        {
        const uint32_t tail_offset = in->cnt - in->tail_len;
        // Can just cut the tail slightly
        if (tail_offset < right)
          {
          ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
          const uint32_t new_tail_len = right - tail_offset;
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(new_tail_len);
          //memcpy(new_tail->child, in->tail->child, new_tail_len * sizeof(T));
          for (uint32_t i = 0; i < new_tail_len; ++i)
            new_tail->child[i] = in->tail->child[i]; // don't memcpy, but use copy constructor

          new_rrb->cnt = right;
          new_rrb->tail = new_tail;
          new_rrb->tail_len = new_tail_len;
          return new_rrb;
          }

        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
        ref<tree_node<T, atomic_ref_counting>> root = rrb_drop_right_rec<T, atomic_ref_counting, N>(&new_rrb->shift, in->root, right - 1, in->shift, false);
        new_rrb->cnt = right;
        new_rrb->root = root;

        // Not sure if this is necessary in this part of the program, due to issues
        // wrt. rrb_drop_left and roots without size tables.
        promote_rightmost_leaf(new_rrb);
        new_rrb->tail_len = new_rrb->tail->len;
        return new_rrb;
        }
      else
        {
        return in;
        }
      }